

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

SSTableData * __thiscall MemTable::collectData(SSTableData *__return_storage_ptr__,MemTable *this)

{
  _Self *p_Var1;
  pointer pQVar2;
  NodePosi *ppQVar3;
  _List_iterator<QuadList<SSTableDataEntry>_> local_50;
  QuadListNode<SSTableDataEntry> *local_48;
  QuadListNode<SSTableDataEntry> *bottomEnd;
  _List_iterator<QuadList<SSTableDataEntry>_> local_30;
  QuadListNode<SSTableDataEntry> *local_28;
  QuadListNode<SSTableDataEntry> *bottomStart;
  MemTable *local_18;
  MemTable *this_local;
  SSTableData *new_data;
  
  bottomStart._7_1_ = 0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = this;
  this_local = (MemTable *)__return_storage_ptr__;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(__return_storage_ptr__);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
       ::end(&this->qlist);
  p_Var1 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator--(&local_30);
  pQVar2 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator->(p_Var1);
  ppQVar3 = QuadList<SSTableDataEntry>::first(pQVar2);
  local_28 = (*ppQVar3)->succ;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
       ::end(&this->qlist);
  p_Var1 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator--(&local_50);
  pQVar2 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator->(p_Var1);
  ppQVar3 = QuadList<SSTableDataEntry>::last(pQVar2);
  local_48 = *ppQVar3;
  for (; local_28 != local_48; local_28 = local_28->succ) {
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back
              (__return_storage_ptr__,&local_28->data);
  }
  return __return_storage_ptr__;
}

Assistant:

SSTableData MemTable::collectData() {
    auto new_data = SSTableData{};
    auto *bottomStart = (--qlist.end())->first()->succ;
    auto *bottomEnd = (--qlist.end())->last();
    while (bottomStart != bottomEnd) {
        new_data.push_back(std::move(bottomStart->data));
        bottomStart = bottomStart->succ;
    }
    return new_data;
}